

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zap.c
# Opt level: O2

void buzz(int type,int nd,xchar sx,xchar sy,int dx,int dy)

{
  byte *pbVar1;
  byte bVar2;
  permonst *ppVar3;
  obj *poVar4;
  xchar x;
  bool bVar5;
  coord cVar6;
  boolean bVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  obj *poVar12;
  char *pcVar13;
  undefined7 in_register_00000009;
  ulong uVar14;
  char *pcVar15;
  char cVar16;
  undefined7 in_register_00000011;
  char *pcVar17;
  int iVar18;
  ulong uVar19;
  byte bVar20;
  int y;
  ulong uVar21;
  ulong uVar22;
  uint uVar23;
  char *pcVar24;
  byte bVar25;
  ulong uVar26;
  monst *pmVar27;
  ulong uVar28;
  monst *pmVar29;
  uint uVar30;
  bool bVar31;
  obj *obj;
  bool bVar32;
  bool bVar33;
  boolean shopdamage;
  ulong local_d8;
  uint local_d0;
  int local_cc;
  char *local_c8;
  monst *local_c0;
  uint local_b4;
  ulong local_b0;
  ulong local_a8;
  int local_9c;
  ulong local_98;
  ulong local_90;
  int local_84;
  ulong local_80;
  ulong local_78;
  ulong local_70;
  ulong local_68;
  ulong local_60;
  obj *local_58;
  int local_4c;
  uint local_48;
  int local_44;
  uint local_40;
  int local_3c;
  permonst *local_38;
  
  uVar22 = (ulong)(uint)dy;
  uVar28 = (ulong)(uint)dx;
  local_d0 = (uint)CONCAT71(in_register_00000009,sy);
  local_b4 = (uint)CONCAT71(in_register_00000011,sx);
  uVar14 = (ulong)(uint)-type;
  if (0 < type) {
    uVar14 = (ulong)(uint)type;
  }
  local_84 = (int)uVar14;
  local_80 = uVar14 % 10;
  shopdamage = '\0';
  bVar32 = type - 0x1eU < 0xfffffff6;
  bVar33 = type + 0x13U < 0xfffffff6;
  local_44 = (int)local_80 + 0x17e;
  if (9 < type - 10U) {
    local_44 = 0;
  }
  if (type < -0x1d) {
    uVar14 = local_80;
  }
  local_c8 = flash_types[uVar14];
  if ((u._1052_1_ & 1) != 0) {
    if (type < 0) {
      return;
    }
    uVar8 = zap_hit_mon(u.ustuck,type,nd,&local_58);
    if (u.ustuck == (monst *)0x0) {
      u._1052_1_ = u._1052_1_ & 0xfe;
      pmVar27 = (monst *)0x0;
    }
    else {
      pcVar24 = The(local_c8);
      pcVar13 = mon_nam(u.ustuck);
      pcVar17 = "!";
      if (uVar8 < 5) {
        pcVar17 = ".";
      }
      pcVar15 = "?";
      if (-1 < (int)uVar8) {
        pcVar15 = pcVar17;
      }
      pline("%s rips into %s%s",pcVar24,pcVar13,pcVar15);
      pmVar27 = u.ustuck;
    }
    if (uVar8 == 1000) {
      pmVar27->mhp = 0;
    }
    else if (0 < pmVar27->mhp) {
      return;
    }
    killed(pmVar27);
    return;
  }
  bVar31 = local_84 != 0x18 && (!bVar32 || !bVar33);
  local_9c = nd;
  if (type < 0) {
    newsym((int)u.ux,(int)u.uy);
  }
  uVar8 = mt_random();
  cVar6 = bhitpos;
  local_cc = uVar8 % 7 + 7;
  if (dy == 0 && dx == 0) {
    local_cc = 1;
  }
  local_40 = (uint)bVar31;
  iVar9 = zapdir_to_effect(dx,dy,(int)local_80,bVar31);
  tmp_at(-1,iVar9);
  bVar31 = local_84 == 0x18;
  local_4c = 0xb;
  if (type != -0x18) {
    local_4c = 0;
  }
  local_48 = -(uint)(type != -0x18) | 0xfffffffd;
  local_38 = mons + 0x144;
LAB_00280451:
  do {
    uVar14 = (ulong)local_b4;
    uVar26 = (ulong)local_d0;
    uVar11 = local_d0;
    uVar8 = local_b4;
    if (local_cc < 1) {
LAB_00281b81:
      local_b4 = uVar8;
      local_d0 = uVar11;
      tmp_at(-6,0);
      iVar9 = (int)local_80;
      if (type == 0xb) {
        iVar18 = (int)(char)local_b4;
        y = (int)(char)(byte)local_d0;
        iVar10 = dice(0xc,6);
        iVar9 = (int)local_80;
        explode(iVar18,y,0xb,iVar10,'\0',5);
      }
      if (shopdamage != '\0') {
        if (iVar9 == 1) {
          pcVar24 = "burn away";
        }
        else if (iVar9 == 2) {
          pcVar24 = "shatter";
        }
        else {
          pcVar24 = "destroy";
          if (iVar9 == 4) {
            pcVar24 = "disintegrate";
          }
        }
        pay_for_damage(pcVar24,'\0');
      }
      bhitpos = cVar6;
      return;
    }
    local_cc = local_cc + -1;
    uVar23 = local_b4 + (int)uVar28;
    local_d0 = local_d0 + (int)uVar22;
    uVar30 = (uint)(char)uVar23;
    local_90 = (ulong)uVar30;
    local_3c = uVar30 - 1;
    bVar20 = (byte)local_d0;
    iVar9 = (int)(char)bVar20;
    uVar21 = (ulong)(uVar23 & 0xff);
    uVar19 = (ulong)(local_d0 & 0xff);
    local_68 = uVar26 & 0xff;
    local_60 = uVar14 & 0xff;
    local_78 = uVar14;
    local_70 = uVar19;
    if ((0x4e < (byte)local_3c) || (0x14 < bVar20)) break;
    local_b4 = uVar23;
    if (level->locations[uVar21][uVar19].typ == '\0') {
LAB_002815d3:
      uVar8 = (uint)local_78;
      uVar23 = local_b4;
      break;
    }
    pmVar27 = level->monsters[uVar21][uVar19];
    if (pmVar27 == (monst *)0x0) {
      pmVar27 = (monst *)0x0;
    }
    else if ((pmVar27->field_0x61 & 2) != 0) {
      pmVar27 = (monst *)0x0;
    }
    pmVar29 = (monst *)&level->locations[uVar21][uVar19].typ;
    local_d8 = uVar22;
    local_b0 = uVar28;
    local_a8 = uVar26;
    if ((viz_array[uVar19][uVar21] & 2U) != 0) {
      local_c0 = pmVar27;
      if (pmVar27 == (monst *)0x0) {
        if ((level->locations[uVar21][uVar19].field_0x6 & 8) != 0) {
          unmap_object(uVar30,iVar9);
          uVar30 = (uint)local_90;
          newsym(uVar30,iVar9);
        }
      }
      else {
        if (pmVar27->wormno == '\0') {
          if ((viz_array[pmVar27->my][pmVar27->mx] & 2U) != 0) goto LAB_0028066a;
          if (u.uprops[0x1e].intrinsic == 0) {
            if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_00280603;
            if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_002805fa;
          }
          else {
LAB_002805fa:
            if (ublindf == (obj *)0x0) goto LAB_002806cf;
LAB_00280603:
            if (ublindf->oartifact != '\x1d') goto LAB_002806cf;
          }
          if ((((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0) ||
               (((youmonst.data)->mflags3 & 0x100) != 0)) &&
              ((viz_array[pmVar27->my][pmVar27->mx] & 1U) != 0)) &&
             ((pmVar27->data->mflags3 & 0x200) != 0)) goto LAB_0028066a;
        }
        else {
          bVar7 = worm_known(level,pmVar27);
          if (bVar7 != '\0') {
LAB_0028066a:
            uVar8 = *(uint *)&local_c0->field_0x60;
            if ((((uVar8 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
               (u.uprops[0xc].extrinsic != 0)) {
              if ((uVar8 & 0x280) == 0) goto LAB_002806bb;
            }
            else if (((uVar8 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0)) {
LAB_002806bb:
              if ((u._1052_1_ & 0x20) == 0) goto LAB_00280864;
            }
          }
        }
LAB_002806cf:
        if (((local_c0->data->mflags1 & 0x10000) == 0) &&
           ((poVar12 = which_armor(local_c0,4), poVar12 == (obj *)0x0 ||
            (poVar12 = which_armor(local_c0,4), poVar12->otyp != 0x4f)))) {
          if (u.uprops[0x1e].intrinsic == 0) {
            if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_00280738;
            if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_00280733;
          }
          else {
LAB_00280733:
            if (ublindf != (obj *)0x0) {
LAB_00280738:
              if (ublindf->oartifact == '\x1d') goto LAB_002807d9;
            }
            if ((((youmonst.data == mons + 0x31 || youmonst.data == mons + 0x1e) ||
                 (u.uprops[0x19].extrinsic != 0 || u.uprops[0x19].intrinsic != 0)) ||
                 youmonst.data == mons + 0x32) && (u.uprops[0x19].blocked == 0)) goto LAB_00280864;
          }
LAB_002807d9:
          if ((u.uprops[0x19].extrinsic != 0) &&
             ((u.uprops[0x19].blocked == 0 &&
              (iVar10 = dist2((int)local_c0->mx,(int)local_c0->my,(int)u.ux,(int)u.uy),
              iVar10 < 0x41)))) goto LAB_00280864;
        }
        if ((u.uprops[0x42].intrinsic == 0) &&
           ((u.uprops[0x42].extrinsic == 0 && (bVar7 = match_warn_of_mon(local_c0), bVar7 == '\0')))
           ) {
          map_invisible((char)uVar23,bVar20);
        }
      }
LAB_00280864:
      if (('\x10' < *(char *)pmVar29) ||
         ((((byte)((char)local_78 - 1U) < 0x4f && ((byte)local_a8 < 0x15)) &&
          ((viz_array[local_68][local_60] & 2U) != 0)))) {
        tmp_at(uVar30,iVar9);
      }
      (*windowprocs.win_delay)();
      pmVar27 = local_c0;
    }
    bhitpos.y = (xchar)local_d0;
    bhitpos.x = (xchar)local_b4;
    x = (xchar)uVar30;
    if (type == 0xb) {
      uVar11 = local_d0;
      uVar8 = local_b4;
      if (pmVar27 != (monst *)0x0) goto LAB_00281b81;
LAB_00280984:
      uVar14 = local_a8;
      uVar28 = local_b0;
      uVar22 = local_d8;
      if ((((char)local_b4 != u.ux) || ((char)local_d0 != u.uy)) || (local_cc < 0))
      goto LAB_00281559;
      nomul(0,(char *)0x0);
      if (((u.usteed != (monst *)0x0) && (uVar8 = mt_random(), uVar8 % 3 == 0)) &&
         ((pmVar27 = u.usteed, !bVar31 && (!bVar32 || !bVar33) ||
          (bVar7 = mon_reflects(u.usteed,(char *)0x0), pmVar27 = u.usteed, bVar7 == '\0'))))
      goto LAB_00280abb;
      iVar10 = zap_hit_check((int)u.uac,0);
      if (iVar10 == 0) {
        The(local_c8);
        pline("%s whizzes by you!");
      }
      else {
        local_cc = local_cc + -2;
        pcVar24 = The(local_c8);
        pline("%s hits you!",pcVar24);
        if ((bVar31 || bVar32 && bVar33) &&
           ((youmonst.data == mons + 0x94 || youmonst.data == mons + 0x9d) ||
            u.uprops[0x2a].extrinsic != 0)) {
          if (u.uprops[0x1e].intrinsic == 0) {
            if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_00280a8f;
            if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_00280a8a;
LAB_00280e6d:
            ureflects("But %s reflects from your %s!","it");
          }
          else {
LAB_00280a8a:
            if (ublindf != (obj *)0x0) {
LAB_00280a8f:
              if (ublindf->oartifact == '\x1d') goto LAB_00280e6d;
            }
            pline("For some reason you are not affected.");
          }
          local_b0 = (ulong)(uint)-(int)local_b0;
          local_d8 = (ulong)(uint)-(int)local_d8;
          shieldeff(x,bVar20);
          goto LAB_002814a2;
        }
        iVar10 = 0;
        local_c0 = pmVar29;
        switch(local_80 & 0xffffffff) {
        case 0:
          iVar18 = dice(local_9c,6);
          iVar10 = 0;
          mana_damageu(iVar18,(monst *)0x0,local_c8,0,'\x01');
          break;
        case 1:
          iVar18 = dice(local_9c,6);
          iVar10 = 0;
          fire_damageu(iVar18,(monst *)0x0,local_c8,0,7,'\x01','\0');
          break;
        case 2:
          iVar18 = dice(local_9c,6);
          iVar10 = 0;
          cold_damageu(iVar18,(monst *)0x0,local_c8,0,7);
          break;
        case 3:
          if (u.uprops[3].intrinsic == 0 && u.uprops[3].extrinsic == 0) {
            if ((((byte)youmonst.mintrinsics & 4) == 0) &&
               (iVar10 = 0x19, u.uprops[0x38].extrinsic == 0)) goto LAB_002812d8;
          }
          else if (((u.uprops[3].intrinsic >> 0x1a & 1) != 0) &&
                  ((((u.uprops[3].intrinsic & 0xfbffffff) == 0 && u.uprops[3].extrinsic == 0 &&
                    (((byte)youmonst.mintrinsics & 4) == 0)) && (u.uprops[0x38].extrinsic == 0)))) {
            shieldeff(u.ux,u.uy);
            iVar10 = 0x19;
            if ((((u.uprops[3].intrinsic >> 0x1a & 1) != 0) &&
                ((u.uprops[3].intrinsic & 0xfbffffff) == 0 && u.uprops[3].extrinsic == 0)) &&
               ((((byte)youmonst.mintrinsics & 4) == 0 && (u.uprops[0x38].extrinsic == 0)))) {
              iVar10 = 0xc;
            }
LAB_002812d8:
            iVar10 = dice(local_9c,iVar10);
            fall_asleep(-iVar10,'\x01');
            iVar10 = 0;
            break;
          }
          shieldeff(u.ux,u.uy);
          pcVar24 = "You don\'t feel sleepy.";
LAB_0028143f:
          pline(pcVar24);
          iVar10 = 0;
          break;
        case 4:
          if (local_84 == 0x18) {
            if (u.uprops[4].intrinsic == 0 && u.uprops[4].extrinsic == 0) {
              if (((byte)youmonst.mintrinsics & 8) == 0) goto LAB_002819b4;
            }
            else if (((((u.uprops[4].intrinsic >> 0x1a & 1) != 0) &&
                      ((u.uprops[4].intrinsic & 0xfbffffff) == 0 && u.uprops[4].extrinsic == 0)) &&
                     (((byte)youmonst.mintrinsics & 8) == 0)) &&
                    (uVar8 = mt_random(), uVar8 % 10 == 0)) {
LAB_002819b4:
              if (uarms == (obj *)0x0) {
                if (uarm == (obj *)0x0) {
                  if (uarmc != (obj *)0x0) {
                    destroy_arm(uarmc,'\x01');
                  }
                  if (uarmu != (obj *)0x0) {
                    destroy_arm(uarmu,'\x01');
                  }
                  goto LAB_00281a8f;
                }
                if (uarmc != (obj *)0x0) {
                  destroy_arm(uarmc,'\0');
                }
                destroy_arm(uarm,'\0');
                iVar10 = 0;
              }
              else {
                destroy_arm(uarms,'\0');
                iVar10 = 0;
              }
              break;
            }
            pcVar24 = "You are not disintegrated.";
            goto LAB_0028143f;
          }
          if ((((youmonst.data)->mlet == '7') || (((youmonst.data)->mflags2 & 2) != 0)) ||
             ((youmonst.data == mons + 0x33 || (youmonst.data)->mlet == '\x16') ||
              ((youmonst.data)->mflags2 >> 9 & 1) != 0)) {
            shieldeff(x,bVar20);
            pcVar24 = "You seem unaffected.";
            goto LAB_0028143f;
          }
          if ((u.uprops[0x2c].extrinsic != 0) ||
             ((u.umonnum != u.umonster && (bVar7 = resists_magm(&youmonst), bVar7 != '\0')))) {
            shieldeff(x,bVar20);
            pcVar24 = "You aren\'t affected.";
            goto LAB_0028143f;
          }
LAB_00281a8f:
          killer_format = 0;
          killer = local_c8;
          u.ugrave_arise = local_48;
          done(local_4c);
          uVar19 = local_70;
          pmVar29 = local_c0;
          goto LAB_00281537;
        case 5:
          iVar10 = dice(local_9c,6);
          elec_damageu(iVar10,(monst *)0x0,local_c8,0,7,'\x01');
          iVar10 = 0;
          break;
        case 6:
          poisoned("blast",3,"poisoned blast",0xf);
          break;
        case 7:
          iVar10 = 0;
          local_98 = uVar21;
          if ((u.uprops[7].extrinsic == 0) && (iVar10 = 0, ((byte)youmonst.mintrinsics & 0x40) == 0)
             ) {
            pline("The acid burns!");
            iVar10 = dice(local_9c,6);
            exercise(0,'\0');
          }
          iVar18 = rn2((uint)(u.twoweap == '\0') * 3 + 3);
          if (iVar18 == 0) {
            erode_obj(uwep,'\x01','\x01');
          }
          if ((u.twoweap != '\0') && (uVar8 = mt_random(), uVar8 % 3 == 0)) {
            erode_obj(uswapwep,'\x01','\x01');
          }
          uVar8 = mt_random();
          uVar21 = local_98;
          if (uVar8 % 6 == 0) {
            erode_armor(&youmonst,'\x01');
          }
        }
        if (((type + 0x13U < 0xfffffff6) && (type < 0)) &&
           ((u.uprops[0x32].extrinsic != 0 || u.uprops[0x32].intrinsic != 0 && (iVar10 != 0)))) {
          iVar10 = (iVar10 + 1) / 2;
        }
        losehp(iVar10,local_c8,0);
        uVar19 = local_70;
        pmVar29 = local_c0;
      }
LAB_002814a2:
      if (((int)local_80 == 5) && (bVar7 = resists_blnd(&youmonst), bVar7 == '\0')) {
        pline("You are blinded by the flash!");
        iVar10 = dice(local_9c,0x32);
        make_blinded((long)iVar10,'\0');
        if (u.uprops[0x1e].intrinsic == 0) {
          if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_00281503;
          if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_002814fe;
LAB_00281529:
          pline("Your vision quickly clears.");
        }
        else {
LAB_002814fe:
          if (ublindf != (obj *)0x0) {
LAB_00281503:
            if (ublindf->oartifact == '\x1d') goto LAB_00281529;
          }
        }
      }
LAB_00281537:
      stop_occupation();
      nomul(0,(char *)0x0);
      uVar14 = local_a8;
      uVar28 = local_b0;
      uVar22 = local_d8;
    }
    else {
      iVar10 = zap_over_floor(x,bVar20,type,&shopdamage);
      local_cc = local_cc + iVar10;
      if (pmVar27 == (monst *)0x0) goto LAB_00280984;
      if (-1 < type) {
        pbVar1 = (byte *)((long)&pmVar27->mstrategy + 3);
        *pbVar1 = *pbVar1 & 0xcf;
      }
LAB_00280abb:
      iVar10 = find_mac(pmVar27);
      iVar10 = zap_hit_check(iVar10,local_44);
      if (iVar10 == 0) {
        miss(local_c8,pmVar27);
        uVar14 = local_a8;
        uVar28 = local_b0;
        uVar22 = local_d8;
      }
      else {
        if ((!bVar31 && (!bVar32 || !bVar33)) ||
           (bVar7 = mon_reflects(pmVar27,(char *)0x0), bVar7 == '\0')) {
          uVar8 = *(uint *)&pmVar27->field_0x60;
          local_98 = uVar21;
          uVar11 = zap_hit_mon(pmVar27,type,local_9c,&local_58);
          poVar12 = local_58;
          ppVar3 = pmVar27->data;
          if ((local_84 == 0x18) &&
             ((ppVar3 == mons + 0x144 || ppVar3 == mons + 0x146) || ppVar3 == mons + 0x145)) {
            if (pmVar27->wormno == '\0') {
              if ((viz_array[pmVar27->my][pmVar27->mx] & 2U) != 0) goto LAB_00281e13;
              if (u.uprops[0x1e].intrinsic == 0) {
                if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_00281d42;
                if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_00281d39;
              }
              else {
LAB_00281d39:
                if (ublindf == (obj *)0x0) goto LAB_00281f44;
LAB_00281d42:
                if (ublindf->oartifact != '\x1d') goto LAB_00281f44;
              }
              if ((((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0) ||
                   (((youmonst.data)->mflags3 & 0x100) != 0)) &&
                  ((viz_array[pmVar27->my][pmVar27->mx] & 1U) != 0)) &&
                 ((ppVar3->mflags3 & 0x200) != 0)) goto LAB_00281e13;
            }
            else {
              bVar7 = worm_known(level,pmVar27);
              if (bVar7 != '\0') {
LAB_00281e13:
                uVar8 = *(uint *)&pmVar27->field_0x60;
                if ((((uVar8 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
                   (u.uprops[0xc].extrinsic != 0)) {
                  if ((uVar8 & 0x280) == 0) goto LAB_00281e69;
                }
                else if (((uVar8 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0)) {
LAB_00281e69:
                  if ((u._1052_1_ & 0x20) == 0) {
                    hit(local_c8,'\0',pmVar27,".");
                    pcVar24 = Monnam(pmVar27);
                    pline("%s disintegrates.",pcVar24);
                    pcVar24 = Monnam(pmVar27);
                    pcVar24 = s_suffix(pcVar24);
                    if ((((youmonst.data)->mflags1 & 0x1000) == 0) &&
                       (youmonst.data == mons + 0x1e || youmonst.data == mons + 0x17b)) {
                      pcVar13 = body_part(1);
                    }
                    else {
                      pcVar13 = body_part(1);
                      pcVar13 = makeplural(pcVar13);
                    }
                    pline("%s body reintegrates before your %s!",pcVar24,pcVar13);
                    Monnam(pmVar27);
                    pline("%s resurrects!");
                  }
                }
              }
            }
LAB_00281f44:
            pmVar27->mhp = pmVar27->mhpmax;
            uVar11 = local_d0;
            uVar8 = local_b4;
          }
          else {
            if (((int)local_80 != 4) || (ppVar3 != local_38)) {
              if (uVar11 != 1000) {
                if (pmVar27->mhp < 1) {
                  if (type < 0) {
                    monkilled(pmVar27,local_c8,0xf2);
                    uVar21 = local_98;
                    uVar14 = local_a8;
                    uVar28 = local_b0;
                    uVar22 = local_d8;
                  }
                  else {
                    killed(pmVar27);
                    uVar21 = local_98;
                    uVar14 = local_a8;
                    uVar28 = local_b0;
                    uVar22 = local_d8;
                  }
                  goto LAB_0028141f;
                }
                if (local_58 == (obj *)0x0) {
                  pcVar24 = "!";
                  if (uVar11 < 5) {
                    pcVar24 = ".";
                  }
                  if ((int)uVar11 < 0) {
                    pcVar24 = "?";
                  }
                  hit(local_c8,'\0',pmVar27,pcVar24);
                }
                else {
                  if (pmVar27->wormno == '\0') {
                    if ((viz_array[pmVar27->my][pmVar27->mx] & 2U) != 0) goto LAB_0028189b;
                    if (u.uprops[0x1e].intrinsic == 0) {
                      if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_00280e1b;
                      if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_00280e12;
                    }
                    else {
LAB_00280e12:
                      if (ublindf == (obj *)0x0) goto LAB_0028192e;
LAB_00280e1b:
                      if (ublindf->oartifact != '\x1d') goto LAB_0028192e;
                    }
                    if ((((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0) ||
                         (((youmonst.data)->mflags3 & 0x100) != 0)) &&
                        ((viz_array[pmVar27->my][pmVar27->mx] & 1U) != 0)) &&
                       ((ppVar3->mflags3 & 0x200) != 0)) goto LAB_0028189b;
                  }
                  else {
                    bVar7 = worm_known(level,pmVar27);
                    if (bVar7 != '\0') {
LAB_0028189b:
                      uVar11 = *(uint *)&pmVar27->field_0x60;
                      if ((((uVar11 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
                         (u.uprops[0xc].extrinsic != 0)) {
                        if ((uVar11 & 0x280) == 0) goto LAB_002818e8;
                      }
                      else if (((uVar11 & 0x280) == 0) &&
                              (((youmonst.data)->mflags1 & 0x1000000) != 0)) {
LAB_002818e8:
                        if ((u._1052_1_ & 0x20) == 0) {
                          pcVar24 = Monnam(pmVar27);
                          pcVar24 = s_suffix(pcVar24);
                          pcVar13 = distant_name(poVar12,xname);
                          pline("%s %s is disintegrated!",pcVar24,pcVar13);
                        }
                      }
                    }
                  }
LAB_0028192e:
                  m_useup(pmVar27,poVar12);
                }
                uVar21 = local_98;
                uVar14 = local_a8;
                uVar30 = (uint)local_90;
                uVar28 = local_b0;
                uVar22 = local_d8;
                if (((uVar8 >> 0x12 & 1) != 0) && ((pmVar27->field_0x62 & 4) == 0)) {
                  local_c0 = pmVar29;
                  slept_monst(pmVar27);
                  uVar28 = local_b0;
                  uVar22 = local_d8;
                  pmVar29 = local_c0;
                }
                goto LAB_0028141f;
              }
              poVar12 = mlifesaver(pmVar27);
              if (pmVar27->wormno == '\0') {
                if ((viz_array[pmVar27->my][pmVar27->mx] & 2U) != 0) goto LAB_002811ab;
                if (u.uprops[0x1e].intrinsic == 0) {
                  if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_00280d74;
                  if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_00280d6b;
                }
                else {
LAB_00280d6b:
                  if (ublindf == (obj *)0x0) goto LAB_00281328;
LAB_00280d74:
                  if (ublindf->oartifact != '\x1d') goto LAB_00281328;
                }
                if ((((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0) ||
                     (((youmonst.data)->mflags3 & 0x100) != 0)) &&
                    ((viz_array[pmVar27->my][pmVar27->mx] & 1U) != 0)) &&
                   ((pmVar27->data->mflags3 & 0x200) != 0)) goto LAB_002811ab;
              }
              else {
                bVar7 = worm_known(level,pmVar27);
                if (bVar7 != '\0') {
LAB_002811ab:
                  uVar8 = *(uint *)&pmVar27->field_0x60;
                  if ((((uVar8 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
                     (u.uprops[0xc].extrinsic != 0)) {
                    if ((uVar8 & 0x280) == 0) goto LAB_00281203;
                  }
                  else if (((uVar8 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0))
                  {
LAB_00281203:
                    if ((u._1052_1_ & 0x20) == 0) {
                      if (poVar12 == (obj *)0x0) {
                        Monnam(pmVar27);
                        pline("%s is disintegrated!");
                      }
                      else {
                        hit(local_c8,'\0',pmVar27,"!");
                      }
                    }
                  }
                }
              }
LAB_00281328:
              poVar4 = pmVar27->minvent;
              local_c0 = pmVar29;
              while (obj = poVar4, obj != (obj *)0x0) {
                poVar4 = obj->nobj;
                if ((obj == poVar12) ||
                   (((objects[obj->otyp].oc_oprop != '\x04' &&
                     (bVar7 = obj_resists(obj,5,0x32), bVar7 == '\0')) &&
                    (bVar7 = is_quest_artifact(obj), bVar7 == '\0')))) {
                  if ((obj->owornmask != 0) && (obj->otyp == 0xf0)) {
                    pbVar1 = (byte *)((long)&pmVar27->misc_worn_check + 2);
                    *pbVar1 = *pbVar1 & 0xef;
                  }
                  update_mon_intrinsics(level,pmVar27,obj,'\0','\x01');
                  obj_extract_self(obj);
                  obfree(obj,(obj *)0x0);
                }
              }
              local_58 = (obj *)0x0;
              if (type < 0) {
                monkilled(pmVar27,(char *)0x0,-0xf2);
              }
              else {
                xkilled(pmVar27,2);
              }
              uVar30 = (uint)local_90;
              uVar19 = local_70;
              uVar21 = local_98;
              uVar14 = local_a8;
              uVar28 = local_b0;
              uVar22 = local_d8;
              pmVar29 = local_c0;
              goto LAB_0028141f;
            }
            if (pmVar27->wormno == '\0') {
              if ((viz_array[pmVar27->my][pmVar27->mx] & 2U) == 0) {
                uVar8 = local_b4;
                uVar11 = local_d0;
                if (u.uprops[0x1e].intrinsic == 0) {
                  if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_00281da1;
                  if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_00281d98;
                }
                else {
LAB_00281d98:
                  if (ublindf == (obj *)0x0) goto LAB_00281b81;
LAB_00281da1:
                  if (ublindf->oartifact != '\x1d') goto LAB_00281b81;
                }
                if ((((u.uprops[0x40].extrinsic == 0 && u.uprops[0x40].intrinsic == 0) &&
                     (((youmonst.data)->mflags3 & 0x100) == 0)) ||
                    ((viz_array[pmVar27->my][pmVar27->mx] & 1U) == 0)) ||
                   ((ppVar3->mflags3 & 0x200) == 0)) goto LAB_00281b81;
              }
            }
            else {
              bVar7 = worm_known(level,pmVar27);
              uVar11 = local_d0;
              uVar8 = local_b4;
              if (bVar7 == '\0') goto LAB_00281b81;
            }
            uVar30 = *(uint *)&pmVar27->field_0x60;
            uVar8 = local_b4;
            uVar11 = local_d0;
            if ((((uVar30 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
               (u.uprops[0xc].extrinsic != 0)) {
              if ((uVar30 & 0x280) != 0) goto LAB_00281b81;
            }
            else if (((uVar30 & 0x280) != 0) || (((youmonst.data)->mflags1 & 0x1000000) == 0))
            goto LAB_00281b81;
            if ((u._1052_1_ & 0x20) == 0) {
              hit(local_c8,'\0',pmVar27,".");
              pcVar24 = Monnam(pmVar27);
              pcVar13 = "ray";
              if (type == 0x18) {
                pcVar13 = "bolt";
              }
              pline("%s absorbs the deadly %s!",pcVar24,pcVar13);
              pline("It seems even stronger than before.");
              uVar11 = local_d0;
              uVar8 = local_b4;
            }
          }
          goto LAB_00281b81;
        }
        if ((viz_array[pmVar27->my][pmVar27->mx] & 2U) != 0) {
          hit(local_c8,'\0',pmVar27,".");
          shieldeff(pmVar27->mx,pmVar27->my);
          mon_reflects(pmVar27,"But it reflects from %s %s!");
        }
        uVar14 = local_a8;
        uVar28 = (ulong)(uint)-(int)local_b0;
        uVar22 = (ulong)(uint)-(int)local_d8;
LAB_0028141f:
        local_cc = local_cc + -2;
      }
    }
LAB_00281559:
    uVar11 = (uint)uVar14;
    if (((local_84 != 0x18) && ((int)local_80 == 4)) && (*(char *)&pmVar29->nmon == '\r')) {
      *(schar *)&pmVar29->nmon = '\x0e';
      uVar11 = local_d0;
      uVar8 = local_b4;
      if ((viz_array[uVar19][uVar21] & 2U) != 0) {
        pline("The tree withers!");
        newsym(uVar30,iVar9);
        uVar11 = local_d0;
        uVar8 = local_b4;
      }
      goto LAB_00281b81;
    }
    if (*(char *)&pmVar29->nmon < '\x11') goto LAB_002815d3;
    local_98 = uVar21;
    bVar7 = closed_door(level,(int)local_90,iVar9);
    uVar8 = (uint)local_78;
  } while ((bVar7 == '\0') || (uVar21 = local_98, uVar23 = local_b4, local_cc < 0));
  local_b4 = uVar23;
  if (type == 0xb) goto LAB_00281b81;
  local_cc = local_cc + -1;
  bVar20 = (char)uVar8 - 1;
  bVar25 = (byte)uVar11;
  local_d8 = uVar22;
  if (((bVar20 < 0x4f) && (local_cc != 0)) &&
     ((bVar25 < 0x15 && ((viz_array[local_68][local_60] & 2U) != 0)))) {
    The(local_c8);
    pline("%s bounces!");
  }
  iVar10 = (int)uVar28;
  if ((iVar10 == 0) || ((int)local_d8 == 0)) {
LAB_002816f1:
    uVar28 = (ulong)(uint)-iVar10;
    uVar22 = (ulong)(uint)-(int)local_d8;
    goto LAB_00280451;
  }
  uVar8 = mt_random();
  uVar22 = local_68;
  cVar16 = (char)local_78;
  if (uVar8 % 0x14 == 0) goto LAB_002816f1;
  bVar5 = true;
  if ((((byte)local_3c < 0x4f) && (bVar25 < 0x15)) &&
     (bVar2 = level->locations[uVar21][local_68].typ, 0x10 < bVar2)) {
    bVar7 = closed_door(level,(int)local_90,(int)(char)bVar25);
    cVar16 = (char)local_78;
    if ((bVar7 == '\0') &&
       ((0x18 < bVar2 ||
        (((iVar10 + (int)local_90) - 1U < 0x4f &&
         ('\x10' < level->locations[(uint)((int)local_90 + iVar10)][uVar22].typ)))))) {
      bVar5 = false;
    }
  }
  uVar22 = local_60;
  if (((bVar20 < 0x4f) && ((byte)local_d0 < 0x15)) &&
     ((bVar20 = level->locations[local_60][local_70].typ, 0x10 < bVar20 &&
      (bVar7 = closed_door(level,(int)cVar16,iVar9), bVar7 == '\0')))) {
    if (bVar20 < 0x19) {
      if ((0x14 < (uint)(iVar9 + (int)local_d8)) ||
         (level->locations[uVar22][(uint)(iVar9 + (int)local_d8)].typ < '\x11')) goto LAB_00281795;
    }
    if ((bVar5) || (uVar8 = mt_random(), (uVar8 & 1) != 0)) {
      uVar28 = (ulong)(uint)-iVar10;
      uVar22 = local_d8;
      goto LAB_002817ad;
    }
  }
  else {
LAB_00281795:
    uVar28 = uVar28 & 0xffffffff;
    if (bVar5) {
      uVar28 = (ulong)(uint)-iVar10;
    }
  }
  uVar22 = (ulong)(uint)-(int)local_d8;
LAB_002817ad:
  iVar9 = zapdir_to_effect((int)uVar28,(int)uVar22,(int)local_80,(boolean)local_40);
  tmp_at(-5,iVar9);
  goto LAB_00280451;
}

Assistant:

void buzz(int type, int nd, xchar sx, xchar sy, int dx, int dy)
{
    int range, abstype = abs(type) % 10;
    struct rm *loc;
    xchar lsx, lsy;
    struct monst *mon;
    coord save_bhitpos;
    boolean shopdamage = FALSE;
    const char *fltxt;
    struct obj *otmp;
    int spell_type;
    boolean is_breath = (type >= 20 && type <= 29) ||
			(type >= -29 && type <= -20);
    /* show breath glyphs for non-reflectable breaths (any but disintegration) */
    boolean show_breath_glyph = is_breath && abs(type) != ZT_BREATH(ZT_DEATH);

    /* if its a Hero Spell then get its SPE_TYPE */
    spell_type = is_hero_spell(type) ? SPE_MAGIC_MISSILE + abstype : 0;

    fltxt = flash_types[(type <= -30) ? abstype : abs(type)];
    if (u.uswallow) {
	int tmp;

	if (type < 0) return;
	tmp = zap_hit_mon(u.ustuck, type, nd, &otmp);
	if (!u.ustuck)	u.uswallow = 0;
	else	pline("%s rips into %s%s",
		      The(fltxt), mon_nam(u.ustuck), exclam(tmp));
	/* Using disintegration from the inside only makes a hole... */
	if (tmp == MAGIC_COOKIE)
	    u.ustuck->mhp = 0;
	if (u.ustuck->mhp < 1)
	    killed(u.ustuck);
	return;
    }
    if (type < 0) newsym(u.ux,u.uy);
    range = rn1(7,7);
    if (dx == 0 && dy == 0) range = 1;
    save_bhitpos = bhitpos;

    tmp_at(DISP_BEAM, zapdir_to_effect(dx, dy, abstype, show_breath_glyph));
    while (range-- > 0) {
	lsx = sx; sx += dx;
	lsy = sy; sy += dy;
	if (isok(sx,sy) && (loc = &level->locations[sx][sy])->typ) {
	    mon = m_at(level, sx, sy);
	    if (cansee(sx,sy)) {
		/* reveal/unreveal invisible monsters before tmp_at() */
		if (mon && !canspotmon(level, mon))
		    map_invisible(sx, sy);
		else if (!mon && level->locations[sx][sy].mem_invis) {
		    unmap_object(sx, sy);
		    newsym(sx, sy);
		}
		if (ZAP_POS(loc->typ) || (isok(lsx,lsy) && cansee(lsx,lsy)))
		    tmp_at(sx,sy);
		win_delay_output(); /* wait a little */
	    }
	} else
	    goto make_bounce;

	/* hit() and miss() need bhitpos to match the target */
	bhitpos.x = sx,  bhitpos.y = sy;
	/* Fireballs only damage when they explode */
	if (type != ZT_SPELL(ZT_FIRE))
	    range += zap_over_floor(sx, sy, type, &shopdamage);

	if (mon) {
	    if (type == ZT_SPELL(ZT_FIRE)) break;
	    if (type >= 0) mon->mstrategy &= ~STRAT_WAITMASK;
buzzmonst:
	    if (zap_hit_check(find_mac(mon), spell_type)) {
		/* breaths (except disintegration) are not blocked by reflection */
		if ((!is_breath || abs(type) == ZT_BREATH(ZT_DEATH)) &&
		    mon_reflects(mon, NULL)) {
		    if (cansee(mon->mx,mon->my)) {
			hit(fltxt, FALSE, mon, exclam(0));
			shieldeff(mon->mx, mon->my);
			mon_reflects(mon, "But it reflects from %s %s!");
		    }
		    dx = -dx;
		    dy = -dy;
		} else {
		    boolean mon_could_move = mon->mcanmove;
		    int tmp = zap_hit_mon(mon, type, nd, &otmp);

		    if (is_rider(mon->data) && abs(type) == ZT_BREATH(ZT_DEATH)) {
			if (canseemon(level, mon)) {
			    hit(fltxt, FALSE, mon, ".");
			    pline("%s disintegrates.", Monnam(mon));
			    pline("%s body reintegrates before your %s!",
				  s_suffix(Monnam(mon)),
				  (eyecount(youmonst.data) == 1) ?
				  	body_part(EYE) : makeplural(body_part(EYE)));
			    pline("%s resurrects!", Monnam(mon));
			}
			mon->mhp = mon->mhpmax;
			break; /* Out of while loop */
		    }
		    if (mon->data == &mons[PM_DEATH] && abstype == ZT_DEATH) {
			if (canseemon(level, mon)) {
			    hit(fltxt, FALSE, mon, ".");
			    pline("%s absorbs the deadly %s!", Monnam(mon),
				  type == ZT_BREATH(ZT_DEATH) ?
					"bolt" : "ray");
			    pline("It seems even stronger than before.");
			}
			break; /* Out of while loop */
		    }

		    if (tmp == MAGIC_COOKIE) { /* disintegration */
			struct obj *otmp2, *m_amulet = mlifesaver(mon);

			if (canseemon(level, mon)) {
			    if (!m_amulet)
				pline("%s is disintegrated!", Monnam(mon));
			    else
				hit(fltxt, FALSE, mon, "!");
			}

/* note: worn amulet of life saving must be preserved in order to operate */
#ifndef oresist_disintegration
#define oresist_disintegration(obj) \
		(objects[obj->otyp].oc_oprop == DISINT_RES || \
		 obj_resists(obj, 5, 50) || is_quest_artifact(obj) || \
		 obj == m_amulet)
#endif

			for (otmp = mon->minvent; otmp; otmp = otmp2) {
			    otmp2 = otmp->nobj;
			    if (otmp == m_amulet || !oresist_disintegration(otmp)) {
				/* update the monsters intrinsics and saddle in
				 * case it is lifesaved. */
				if (otmp->owornmask && otmp->otyp == SADDLE)
				    mon->misc_worn_check &= ~W_SADDLE;
				update_mon_intrinsics(level, mon, otmp, FALSE, TRUE);
				obj_extract_self(otmp);
				obfree(otmp, NULL);
			    }
			}

			if (type < 0)
			    monkilled(mon, NULL, -AD_RBRE);
			else
			    xkilled(mon, 2);
		    } else if (mon->mhp < 1) {
			if (type < 0)
			    monkilled(mon, fltxt, AD_RBRE);
			else
			    killed(mon);
		    } else {
			if (!otmp) {
			    /* normal non-fatal hit */
			    hit(fltxt, FALSE, mon, exclam(tmp));
			} else {
			    /* some armor was destroyed; no damage done */
			    if (canseemon(level, mon))
				pline("%s %s is disintegrated!",
				      s_suffix(Monnam(mon)),
				      distant_name(otmp, xname));
			    m_useup(mon, otmp);
			}
			if (mon_could_move && !mon->mcanmove)	/* ZT_SLEEP */
			    slept_monst(mon);
		    }
		}
		range -= 2;
	    } else {
		miss(fltxt,mon);
	    }
	} else if (sx == u.ux && sy == u.uy && range >= 0) {
	    nomul(0, NULL);
	    /* breaths (except disintegration) are not blocked by reflection */
	    if (u.usteed && !rn2(3) &&
		!((!is_breath || abs(type) == ZT_BREATH(ZT_DEATH)) &&
		  mon_reflects(u.usteed, NULL))) {
		    mon = u.usteed;
		    goto buzzmonst;
	    } else if (zap_hit_check((int) u.uac, 0)) {
		range -= 2;
		pline("%s hits you!", The(fltxt));
		/* breaths (except disintegration) are not blocked by reflection */
		if ((!is_breath || abs(type) == ZT_BREATH(ZT_DEATH)) && Reflecting) {
		    if (!Blind) {
		    	ureflects("But %s reflects from your %s!", "it");
		    } else
			pline("For some reason you are not affected.");
		    dx = -dx;
		    dy = -dy;
		    shieldeff(sx, sy);
		} else {
		    zap_hit_u(type, nd, fltxt, sx, sy);
		}
	    } else {
		pline("%s whizzes by you!", The(fltxt));
	    }
	    if (abstype == ZT_LIGHTNING && !resists_blnd(&youmonst)) {
		pline(blinded_by_the_flash);
		make_blinded((long)dice(nd,50),FALSE);
		if (!Blind) pline("Your vision quickly clears.");
	    }
	    stop_occupation();
	    nomul(0, NULL);
	}

	if (loc->typ == TREE && abstype == ZT_DEATH &&
	    abs(type) != ZT_BREATH(ZT_DEATH)) {
	    loc->typ = DEADTREE;
	    if (cansee(sx, sy)) {
		pline("The tree withers!");
		newsym(sx, sy);
	    }
	    range = 0;
	    break;
	}

	if (!ZAP_POS(loc->typ) || (closed_door(level, sx, sy) && (range >= 0))) {
	    int bounce;
	    uchar rmn;

 make_bounce:
	    if (type == ZT_SPELL(ZT_FIRE)) {
		sx = lsx;
		sy = lsy;
		break; /* fireballs explode before the wall */
	    }
	    bounce = 0;
	    range--;
	    if (range && isok(lsx, lsy) && cansee(lsx,lsy))
		pline("%s bounces!", The(fltxt));
	    if (!dx || !dy || !rn2(20)) {
		dx = -dx;
		dy = -dy;
	    } else {
		if (isok(sx,lsy) && ZAP_POS(rmn = level->locations[sx][lsy].typ) &&
		   !closed_door(level, sx,lsy) &&
		   (IS_ROOM(rmn) || (isok(sx+dx,lsy) &&
				     ZAP_POS(level->locations[sx+dx][lsy].typ))))
		    bounce = 1;
		if (isok(lsx,sy) && ZAP_POS(rmn = level->locations[lsx][sy].typ) &&
		   !closed_door(level, lsx,sy) &&
		   (IS_ROOM(rmn) || (isok(lsx,sy+dy) &&
				     ZAP_POS(level->locations[lsx][sy+dy].typ))))
		    if (!bounce || rn2(2))
			bounce = 2;

		switch(bounce) {
		case 0: dx = -dx; /* fall into... */
		case 1: dy = -dy; break;
		case 2: dx = -dx; break;
		}
		tmp_at(DISP_CHANGE, zapdir_to_effect(dx, dy, abstype,
						     show_breath_glyph));
	    }
	}
    }
    tmp_at(DISP_END,0);
    if (type == ZT_SPELL(ZT_FIRE))
	explode(sx, sy, type, dice(12,6), 0, EXPL_FIERY);
    if (shopdamage)
	pay_for_damage(abstype == ZT_FIRE ?  "burn away" :
		       abstype == ZT_COLD ?  "shatter" :
		       abstype == ZT_DEATH ? "disintegrate" : "destroy", FALSE);
    bhitpos = save_bhitpos;
}